

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

MeshAttributeCornerTable * __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::GetAttributeCornerTable
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,int att_id)

{
  pointer pAVar1;
  MeshAttributeCornerTable *pMVar2;
  uint uVar3;
  ulong uVar4;
  
  pAVar1 = (this->attribute_data_).
           super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  do {
    uVar4 = (ulong)uVar3;
    if ((ulong)(((long)(this->attribute_data_).
                       super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x130) <= uVar4)
    {
      return (MeshAttributeCornerTable *)0x0;
    }
    uVar3 = uVar3 + 1;
  } while (pAVar1[uVar4].attribute_index != att_id);
  pMVar2 = (MeshAttributeCornerTable *)0x0;
  if (pAVar1[uVar4].is_connectivity_used != false) {
    pMVar2 = &pAVar1[uVar4].connectivity_data;
  }
  return pMVar2;
}

Assistant:

const MeshAttributeCornerTable *
MeshEdgebreakerEncoderImpl<TraversalEncoder>::GetAttributeCornerTable(
    int att_id) const {
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    if (attribute_data_[i].attribute_index == att_id) {
      if (attribute_data_[i].is_connectivity_used) {
        return &attribute_data_[i].connectivity_data;
      }
      return nullptr;
    }
  }
  return nullptr;
}